

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScsAddress.cpp
# Opt level: O0

void __thiscall Scs::Address::Address(Address *this,String *port,String *address)

{
  uint uVar1;
  size_type sVar2;
  char *__service;
  char *local_70;
  int result;
  char *addressStr;
  addrinfo hints;
  String *address_local;
  String *port_local;
  Address *this_local;
  
  this->m_address = (addrinfo *)0x0;
  hints.ai_next = (addrinfo *)address;
  memset(&addressStr,0,0x30);
  addressStr._4_4_ = 2;
  hints.ai_flags = 1;
  sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Scs::Allocator<char>_>::size
                    ((basic_string<char,_std::char_traits<char>,_Scs::Allocator<char>_> *)
                     hints.ai_next);
  if (sVar2 == 0) {
    local_70 = (char *)0x0;
  }
  else {
    local_70 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Scs::Allocator<char>_>::
               c_str((basic_string<char,_std::char_traits<char>,_Scs::Allocator<char>_> *)
                     hints.ai_next);
  }
  __service = std::__cxx11::basic_string<char,_std::char_traits<char>,_Scs::Allocator<char>_>::c_str
                        (port);
  uVar1 = getaddrinfo(local_70,__service,(addrinfo *)&addressStr,(addrinfo **)this);
  if (uVar1 != 0) {
    LogWriteLine("getaddrinfo failed: %d",(ulong)uVar1);
  }
  this->m_current = this->m_address;
  Log(this);
  return;
}

Assistant:

Address::Address(const String & port, const String & address)
{
	// Client setup

	// Set up structures
	m_address = NULL;
	addrinfo hints;
	memset(&hints, 0, sizeof(hints));
	hints.ai_family = AF_INET; // Note: Windows fails to connect if left unspecified
	hints.ai_socktype = SOCK_STREAM;
	//hints.ai_protocol = IPPROTO_TCP;

	// Resolve the local address (if required) and port to be used by the socket
	const char * addressStr = address.size() > 0 ? address.c_str() : nullptr;
	int result = getaddrinfo(addressStr, port.c_str(), &hints, &m_address);
	if (result != 0)
	{
		LogWriteLine("getaddrinfo failed: %d", result);
	}
	m_current = m_address;
	Log();
}